

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void slang::ast::GenvarSymbol::fromSyntax
               (Scope *parent,GenvarDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::GenvarSymbol_*> *results)

{
  IdentifierNameSyntax *pIVar1;
  Symbol *this;
  string_view sVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  const_iterator __begin2;
  GenvarSymbol *genvar;
  Token name;
  iterator_base<const_slang::syntax::IdentifierNameSyntax_*> local_90;
  ulong local_80;
  Compilation *local_78;
  Scope *local_70;
  SmallVectorBase<const_slang::ast::GenvarSymbol_*> *local_68;
  SourceLocation local_60;
  string_view local_58;
  Token local_48;
  
  local_78 = parent->compilation;
  local_90.index = 0;
  local_80 = (syntax->identifiers).elements.size_ + 1 >> 1;
  local_90.list = &syntax->identifiers;
  local_70 = parent;
  local_68 = results;
  for (; (local_90.list != &syntax->identifiers || (local_90.index != local_80));
      local_90.index = local_90.index + 1) {
    pIVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
             iterator_base<const_slang::syntax::IdentifierNameSyntax_*>::operator*(&local_90);
    local_48.kind = (pIVar1->identifier).kind;
    local_48._2_1_ = (pIVar1->identifier).field_0x2;
    local_48.numFlags.raw = (pIVar1->identifier).numFlags.raw;
    local_48.rawLen = (pIVar1->identifier).rawLen;
    local_48.info = (pIVar1->identifier).info;
    sVar2 = parsing::Token::valueText(&local_48);
    if (sVar2._M_len != 0) {
      local_58 = parsing::Token::valueText(&local_48);
      local_60 = parsing::Token::location(&local_48);
      this = &BumpAllocator::
              emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                        (&local_78->super_BumpAllocator,&local_58,&local_60)->super_Symbol;
      local_58._M_len = (size_t)this;
      this->originatingSyntax = (SyntaxNode *)pIVar1;
      syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span
                            ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
      Symbol::setAttributes(this,local_70,syntax_00);
      SmallVectorBase<slang::ast::GenvarSymbol_const*>::
      emplace_back<slang::ast::GenvarSymbol_const*const&>
                ((SmallVectorBase<slang::ast::GenvarSymbol_const*> *)local_68,
                 (GenvarSymbol **)&local_58);
    }
  }
  return;
}

Assistant:

void GenvarSymbol::fromSyntax(const Scope& parent, const GenvarDeclarationSyntax& syntax,
                              SmallVectorBase<const GenvarSymbol*>& results) {
    auto& comp = parent.getCompilation();
    for (auto id : syntax.identifiers) {
        auto name = id->identifier;
        if (name.valueText().empty())
            continue;

        auto genvar = comp.emplace<GenvarSymbol>(name.valueText(), name.location());
        genvar->setSyntax(*id);
        genvar->setAttributes(parent, syntax.attributes);
        results.push_back(genvar);
    }
}